

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O1

int CFITS2Unit(fitsfile *fptr)

{
  ulong uVar1;
  int status;
  int local_1c;
  
  local_1c = 0;
  uVar1 = (ulong)CFITS2Unit::last_unit;
  if ((uVar1 == 0) || (gFitsFiles[uVar1] != fptr)) {
    uVar1 = 1;
    do {
      CFITS2Unit::last_fptr = fptr;
      if (gFitsFiles[uVar1] == fptr) {
        CFITS2Unit::last_unit = (int)uVar1;
        goto LAB_00159064;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != 10000);
    CFITS2Unit::last_unit = 10000;
    Cffgiou(&CFITS2Unit::last_unit,&local_1c);
    if (local_1c == 0) {
      gFitsFiles[CFITS2Unit::last_unit] = fptr;
    }
    else {
      CFITS2Unit::last_unit = 0;
    }
    uVar1 = (ulong)(uint)CFITS2Unit::last_unit;
  }
LAB_00159064:
  return (int)uVar1;
}

Assistant:

int CFITS2Unit( fitsfile *fptr )
     /* Utility routine to convert a fitspointer to a Fortran unit number */
     /* for use when a C program is calling a Fortran routine which could */
     /* in turn call CFITSIO... Modelled after code by Ning Gan.          */
{
   static fitsfile *last_fptr = (fitsfile *)NULL; /* Remember last fptr */
   static int last_unit = 0;                      /* Remember last unit */
   int status = 0;

   /*  Test whether we are repeating the last lookup  */

   if( last_unit && fptr==gFitsFiles[last_unit] )
      return( last_unit );

   /*  Check if gFitsFiles has an entry for this fptr.  */
   /*  Allows Fortran to call C to call Fortran to      */
   /*  call CFITSIO... OUCH!!!                          */

   last_fptr = fptr;
   for( last_unit=1; last_unit<NMAXFILES; last_unit++ ) {
      if( fptr == gFitsFiles[last_unit] )
	 return( last_unit );
   }

   /*  Allocate a new unit number for this fptr  */
   Cffgiou( &last_unit, &status );
   if( status )
      last_unit = 0;
   else
      gFitsFiles[last_unit] = fptr;
   return( last_unit );
}